

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnLoadZero
          (SharedValidator *this,Location *loc,Opcode opcode,Var *memidx,Address alignment)

{
  Result RVar1;
  Address natural_alignment;
  Var local_a0;
  Enum local_54;
  undefined1 local_50 [8];
  MemoryType mt;
  Address alignment_local;
  Var *memidx_local;
  Location *loc_local;
  SharedValidator *this_local;
  Opcode opcode_local;
  Result result;
  
  mt.limits._20_4_ = opcode.enum_;
  this_local._0_4_ = opcode.enum_;
  this_local._4_4_ = CheckInstr(this,opcode,loc);
  MemoryType::MemoryType((MemoryType *)local_50);
  Var::Var(&local_a0,memidx);
  local_54 = (Enum)CheckMemoryIndex(this,&local_a0,(MemoryType *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_54);
  Var::~Var(&local_a0);
  natural_alignment = Opcode::GetMemorySize((Opcode *)&this_local);
  RVar1 = CheckAlign(this,loc,alignment,natural_alignment);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = TypeChecker::OnLoad(&this->typechecker_,this_local._0_4_,(Limits *)local_50);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnLoadZero(const Location& loc,
                                   Opcode opcode,
                                   Var memidx,
                                   Address alignment) {
  Result result = CheckInstr(opcode, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= CheckAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnLoad(opcode, mt.limits);
  return result;
}